

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O2

void __thiscall
MobileElement::MobileElement(MobileElement *this,string *name,int footprint,double speed)

{
  string *__rhs;
  invalid_argument *piVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->super_enable_shared_from_this<MobileElement>)._M_weak_this.
  super___weak_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<MobileElement>)._M_weak_this.
  super___weak_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_MobileElement = (_func_int **)&PTR___cxa_pure_virtual_0019d610;
  __rhs = &this->name_;
  std::__cxx11::string::string((string *)__rhs,(string *)name);
  this->footprint_ = footprint;
  this->speed_ = speed;
  this->reading_frame_ = -1;
  std::__cxx11::string::string((string *)&this->gene_bound_,"",(allocator *)&local_70);
  this->polymerasereadthrough_ = false;
  this->start_ = 0;
  this->stop_ = this->footprint_;
  if (this->footprint_ < 0) {
    piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,"Mobile element \'",__rhs);
    std::operator+(&local_70,&local_50,"\' has a negative footprint size.");
    std::invalid_argument::invalid_argument(piVar1,(string *)&local_70);
    __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (0.0 < this->speed_ || this->speed_ == 0.0) {
    return;
  }
  piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"Mobile element \'",__rhs);
  std::operator+(&local_70,&local_50,"\' has a negative average speed.");
  std::invalid_argument::invalid_argument(piVar1,(string *)&local_70);
  __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

MobileElement::MobileElement(const std::string &name, int footprint, double speed)
    : name_(name), footprint_(footprint), speed_(speed), reading_frame_(-1) {
  start_ = 0;
  stop_ = start_ + footprint_;
  if (footprint_ < 0) {
    throw std::invalid_argument("Mobile element '" + name_ +
                                "' has a negative footprint size.");
  }
  if (speed_ < 0) {
    throw std::invalid_argument("Mobile element '" + name_ +
                                "' has a negative average speed.");
  }
}